

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point2f pbrt::SampleBilinear(Point2f u,span<const_float> w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float *pfVar3;
  Float FVar4;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Float local_18;
  undefined1 extraout_var [60];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  pfVar3 = w.ptr;
  auVar1 = vmovshdup_avx(auVar5._0_16_);
  FVar4 = SampleLinear(auVar1._0_4_,*pfVar3 + pfVar3[1],pfVar3[2] + pfVar3[3]);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(FVar4 * pfVar3[3])),ZEXT416((uint)(1.0 - FVar4)),
                           ZEXT416((uint)pfVar3[1]));
  local_18 = u.super_Tuple2<pbrt::Point2,_float>.x;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(FVar4 * pfVar3[2])),ZEXT416((uint)(1.0 - FVar4)),
                           ZEXT416((uint)*pfVar3));
  auVar6._0_4_ = SampleLinear(local_18,auVar2._0_4_,auVar1._0_4_);
  auVar6._4_60_ = extraout_var;
  auVar1 = vinsertps_avx(auVar6._0_16_,ZEXT416((uint)FVar4),0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

PBRT_CPU_GPU
inline Point2f SampleBilinear(Point2f u, pstd::span<const Float> w) {
    DCHECK_EQ(4, w.size());
    Point2f p;
    // Sample $v$ for bilinear marginal distribution
    Float v0 = w[0] + w[1], v1 = w[2] + w[3];
    p[1] = SampleLinear(u[1], v0, v1);

    // Sample $u$ for bilinear conditional distribution
    p[0] = SampleLinear(u[0], Lerp(p[1], w[0], w[2]), Lerp(p[1], w[1], w[3]));

    return p;
}